

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFireFightingFactored.h
# Opt level: O2

void __thiscall
ProblemFireFightingFactored::~ProblemFireFightingFactored
          (ProblemFireFightingFactored *this,void **vtt)

{
  void *pvVar1;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(this + *(long *)((long)pvVar1 + -0x58)) = vtt[0x14];
  *(void **)(this + *(long *)(*(long *)this + -0x60)) = vtt[0x15];
  *(void **)(this + *(long *)(*(long *)this + -0x68)) = vtt[0x16];
  *(void **)(this + *(long *)(*(long *)this + -0x70)) = vtt[0x17];
  *(void **)(this + *(long *)(*(long *)this + -0x40)) = vtt[0x18];
  *(void **)(this + *(long *)(*(long *)this + -0x50)) = vtt[0x19];
  *(void **)(this + *(long *)(*(long *)this + -0x48)) = vtt[0x1a];
  *(void **)(this + 0x600) = vtt[0x1b];
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x768));
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x748));
  FactoredDecPOMDPDiscrete::~FactoredDecPOMDPDiscrete((FactoredDecPOMDPDiscrete *)this);
  return;
}

Assistant:

virtual ~ProblemFireFightingFactored(){}